

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,StringTree *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,String *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,ArrayPtr<const_char> *params_12,StringTree *params_13,
          ArrayPtr<const_char> *params_14)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t result_2;
  String local_e8;
  size_t local_d0;
  char *local_c8;
  size_t sStack_c0;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  char *local_a0;
  char *local_98;
  size_t sStack_90;
  size_t local_88;
  size_t local_80;
  size_t sStack_78;
  size_t local_70;
  char *local_68;
  char *local_60;
  StringTree *local_58;
  StringTree *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_d0 = this->size_;
  local_c8 = (params->text).content.ptr;
  sStack_c0 = params_1->size_;
  local_b8 = params_2->size_;
  sStack_b0 = params_3->size_;
  local_a8 = params_4->size_;
  local_a0 = params_5->ptr;
  local_98 = (params_6->text).content.ptr;
  sStack_90 = params_7->size_;
  local_88 = params_8->size_ - 1;
  if (params_8->size_ == 0) {
    local_88 = sVar3;
  }
  local_80 = (params_9->content).size_;
  sStack_78 = params_10->size_;
  local_70 = params_11->size_;
  local_68 = params_12->ptr;
  local_60 = (params_13->text).content.ptr;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_d0 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x78);
  __return_storage_ptr__->size_ = sVar3;
  sVar3 = 0;
  local_d0 = 0;
  local_a0 = (char *)0x0;
  local_88 = 0;
  local_68 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_d0 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x78);
  local_58 = this;
  local_50 = params;
  local_48 = params_1;
  local_40 = params_3;
  local_38 = params_2;
  heapString(&local_e8,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_e8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_e8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_e8.content.disposer;
  local_d0 = 1;
  local_c8 = (char *)0x0;
  sStack_c0 = 0;
  local_b8 = 0;
  sStack_b0 = 0;
  sVar3 = 0;
  local_a8 = 0;
  local_a0 = (char *)0x1;
  local_98 = (char *)0x0;
  sStack_90 = 0;
  local_88 = 1;
  local_80 = 0;
  sStack_78 = 0;
  local_70 = 0;
  local_68 = (char *)0x1;
  local_60 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_d0 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x78);
  local_e8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_e8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_e8.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_e8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_e8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_e8.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,local_58,(ArrayPtr<const_char> *)local_50,local_48,
             local_38,local_40,params_4,(StringTree *)params_5,(ArrayPtr<const_char> *)params_6,
             params_7,(String *)params_8,(ArrayPtr<const_char> *)params_9,params_10,params_11,
             (StringTree *)params_12,(ArrayPtr<const_char> *)params_13);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}